

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::buildDualProblem
          (SPxLPBase<double> *this,SPxLPBase<double> *dualLP,SPxRowId *primalRowIds,
          SPxColId *primalColIds,SPxRowId *dualRowIds,SPxColId *dualColIds,int *nprimalrows,
          int *nprimalcols,int *ndualrows,int *ndualcols)

{
  undefined8 uVar1;
  pointer pdVar2;
  Tolerances *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Item *pIVar5;
  Real RVar6;
  Type TVar7;
  DataKey *pDVar8;
  undefined8 *puVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  SPxLPBase<double> *pSVar14;
  int iVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  uint uVar22;
  int numprimalcols;
  int numprimalrows;
  int numdualcols;
  LPColSetBase<double> dualcols;
  LPRowSetBase<double> dualrows;
  undefined8 local_298;
  DataKey local_290;
  DataKey local_288;
  int local_280;
  int local_27c;
  DataKey local_278;
  SPxColId *local_270;
  undefined8 local_268 [2];
  DSVectorBase<double> local_258;
  DataKey local_238;
  undefined8 uStack_230;
  DataKey local_228;
  undefined8 uStack_220;
  DataKey local_218;
  undefined8 uStack_210;
  SPxLPBase<double> *local_200;
  Real local_1f8;
  SPxRowId *local_1f0;
  SPxRowId *local_1e8;
  SPxColId *local_1e0;
  _func_int **local_1d8;
  SPxColId *local_1d0;
  Real local_1c8;
  undefined1 local_1c0 [8];
  SPxColId *local_1b8;
  Nonzero<double> *local_1b0;
  undefined1 local_f8 [8];
  SPxRowId *local_f0;
  Nonzero<double> *local_e8;
  
  local_200 = dualLP;
  local_1f0 = primalRowIds;
  local_1e8 = dualRowIds;
  local_1e0 = primalColIds;
  local_1d0 = dualColIds;
  if ((dualRowIds == (SPxRowId *)0x0 ||
      (primalColIds == (SPxColId *)0x0 || primalRowIds == (SPxRowId *)0x0)) ||
      dualColIds == (SPxColId *)0x0) {
    iVar15 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    local_f8._0_4_ = iVar15 * 2;
    local_f0 = (SPxRowId *)0x0;
    local_e8 = (Nonzero<double> *)0x3ff3333333333333;
    iVar10 = 0;
    if ((int)local_f8._0_4_ < 1) {
      local_f8._0_4_ = iVar10;
    }
    local_f8._4_4_ = local_f8._0_4_;
    if (iVar15 < 1) {
      local_f8._4_4_ = 1;
    }
    spx_alloc<soplex::SPxRowId*>(&local_f0,local_f8._4_4_);
    iVar15 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    local_1c0._0_4_ = iVar15 * 2;
    local_1b8 = (SPxColId *)0x0;
    local_1b0 = (Nonzero<double> *)0x3ff3333333333333;
    if ((int)local_1c0._0_4_ < 1) {
      local_1c0._0_4_ = iVar10;
    }
    local_1c0._4_4_ = local_1c0._0_4_;
    if (iVar15 < 1) {
      local_1c0._4_4_ = 1;
    }
    spx_alloc<soplex::SPxColId*>(&local_1b8,local_1c0._4_4_);
    iVar15 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    iVar11 = iVar15 * 2;
    local_258.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
    local_258.super_SVectorBase<double>.memsize = 0x33333333;
    local_258.super_SVectorBase<double>.memused = 0x3ff33333;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    iVar11 = iVar10;
    if (iVar15 < 1) {
      iVar11 = 1;
    }
    local_258._vptr_DSVectorBase = (_func_int **)CONCAT44(iVar11,iVar10);
    spx_alloc<soplex::SPxRowId*>((SPxRowId **)&local_258.super_SVectorBase<double>,iVar11);
    iVar15 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    local_278.info = iVar15 * 2;
    local_270 = (SPxColId *)0x0;
    local_268[0] = 0x3ff3333333333333;
    if (local_278.info < 1) {
      local_278.info = 0;
    }
    local_278.idx = 1;
    if (0 < iVar15) {
      local_278.idx = local_278.info;
    }
    spx_alloc<soplex::SPxColId*>(&local_270,local_278.idx);
    local_288 = (DataKey)((ulong)(uint)local_288.idx << 0x20);
    local_290 = (DataKey)((ulong)(uint)local_290.idx << 0x20);
    local_298 = (double)((ulong)local_298._4_4_ << 0x20);
    local_280 = 0;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x4b])
              (this,local_200,local_f0,local_1b8,local_258.super_SVectorBase<double>.m_elem,
               local_270,&local_288,&local_290,&local_298,&local_280);
    if (local_1f0 != (SPxRowId *)0x0) {
      *nprimalrows = local_288.info;
    }
    if (local_1e0 != (SPxColId *)0x0) {
      *nprimalcols = local_290.info;
    }
    if (local_1e8 != (SPxRowId *)0x0) {
      *ndualrows = (int)local_298;
    }
    if (local_1d0 != (SPxColId *)0x0) {
      *ndualcols = local_280;
    }
    if (local_270 != (SPxColId *)0x0) {
      free(local_270);
    }
    if (local_258.super_SVectorBase<double>.m_elem != (Nonzero<double> *)0x0) {
      free(local_258.super_SVectorBase<double>.m_elem);
    }
    if (local_1b8 != (SPxColId *)0x0) {
      free(local_1b8);
    }
    if (local_f0 != (SPxRowId *)0x0) {
      free(local_f0);
    }
  }
  else {
    (*(dualLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x45])
              (dualLP,(ulong)((uint)(this->thesense == MINIMIZE) * 2 - 1));
    LPRowSetBase<double>::LPRowSetBase
              ((LPRowSetBase<double> *)local_f8,
               (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,-1);
    LPColSetBase<double>::LPColSetBase
              ((LPColSetBase<double> *)local_1c0,
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,-1);
    local_258.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
    local_258.super_SVectorBase<double>.memsize = 0;
    local_258.super_SVectorBase<double>.memused = 0;
    local_258._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
    local_258.theelem = (Nonzero<double> *)0x0;
    spx_alloc<soplex::Nonzero<double>*>(&local_258.theelem,1);
    local_1d8 = (_func_int **)&PTR__DSVectorBase_003ae9c8;
    local_258.super_SVectorBase<double>.m_elem = local_258.theelem;
    local_258.super_SVectorBase<double>.memsize = 1;
    local_258.super_SVectorBase<double>.memused = 0;
    if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
      uVar16 = 0;
      local_238.info = 0;
      local_238.idx = 0;
    }
    else {
      pDVar8 = (DataKey *)__tls_get_addr(&PTR_003b4b70);
      local_218 = *pDVar8;
      uStack_210 = 0;
      local_238 = (DataKey)((ulong)local_218 ^ 0x8000000000000000);
      uStack_230 = 0x8000000000000000;
      lVar12 = 0;
      uVar16 = 0;
      local_27c = 0;
      do {
        local_288 = *(DataKey *)
                     ((long)&((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey)
                             ->info + lVar12);
        SPxColId::SPxColId((SPxColId *)&local_278,&local_288);
        *(DataKey *)((long)&(local_1e0->super_DataKey).info + lVar12) = local_278;
        local_228 = *(DataKey *)
                     ((long)(this->super_LPColSetBase<double>).low.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar12);
        iVar15 = (int)uVar16;
        ::soplex::infinity::__tls_init();
        if ((double)local_238 < (double)local_228) {
LAB_001d7523:
          local_228 = *(DataKey *)
                       ((long)(this->super_LPColSetBase<double>).low.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
          ::soplex::infinity::__tls_init();
          pdVar2 = (this->super_LPColSetBase<double>).up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((double)local_228 <= (double)local_238) {
            local_228 = *(DataKey *)((long)pdVar2 + lVar12);
            uStack_220 = 0;
            pTVar3 = (this->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var4 = (this->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              }
            }
            RVar6 = Tolerances::epsilon(pTVar3);
            uVar20 = SUB84(RVar6,0);
            uVar21 = (undefined4)((ulong)RVar6 >> 0x20);
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_1f8 = RVar6;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
              uVar20 = SUB84(local_1f8,0);
              uVar21 = (undefined4)((ulong)local_1f8 >> 0x20);
            }
            if ((double)CONCAT44(uVar21,uVar20) < ABS((double)local_228)) {
              DSVectorBase<double>::makeMem(&local_258,1);
              local_258.super_SVectorBase<double>.m_elem
              [local_258.super_SVectorBase<double>.memused].idx = iVar15;
              local_258.super_SVectorBase<double>.m_elem
              [local_258.super_SVectorBase<double>.memused].val = 1.0;
              local_258.super_SVectorBase<double>.memused =
                   local_258.super_SVectorBase<double>.memused + 1;
              if (this->thesense == MINIMIZE) {
                pdVar2 = (this->super_LPColSetBase<double>).object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_288 = (DataKey)(*(ulong *)((long)pdVar2 + lVar12) ^ 0x8000000000000000);
                local_290 = (DataKey)(*(ulong *)((long)pdVar2 + lVar12) ^ 0x8000000000000000);
                local_298 = 0.0;
                local_280 = 0;
                local_278.info = 0;
                local_278.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                           (double *)&local_290,(double *)&local_298,&local_280);
                pdVar2 = (this->super_LPColSetBase<double>).up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_288 = local_238;
                local_290.info = 0;
                local_290.idx = 0;
                local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                local_278.info = 0;
                local_278.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_278,
                           (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                           &local_258.super_SVectorBase<double>,(double *)&local_290,
                           (int *)&local_298);
              }
              else {
                local_290 = *(DataKey *)
                             ((long)(this->super_LPColSetBase<double>).object.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar12);
                local_298 = 0.0;
                local_280 = 0;
                local_278.info = 0;
                local_278.idx = -1;
                local_288 = local_290;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                           (double *)&local_290,(double *)&local_298,&local_280);
                pdVar2 = (this->super_LPColSetBase<double>).up.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_288.info = 0;
                local_288.idx = 0;
                ::soplex::infinity::__tls_init();
                local_290 = local_218;
                local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                local_278.info = 0;
                local_278.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_278,
                           (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                           &local_258.super_SVectorBase<double>,(double *)&local_290,
                           (int *)&local_298);
              }
              goto LAB_001d88be;
            }
            if (this->thesense == MINIMIZE) {
              local_288 = (DataKey)(*(ulong *)((long)(this->super_LPColSetBase<double>).object.val.
                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar12
                                              ) ^ 0x8000000000000000);
              ::soplex::infinity::__tls_init();
              local_290 = local_218;
              local_298 = 0.0;
              local_280 = 0;
              local_278.info = 0;
              local_278.idx = -1;
              LPRowSetBase<double>::create
                        ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                         (double *)&local_290,(double *)&local_298,&local_280);
            }
            else {
              ::soplex::infinity::__tls_init();
              local_288 = local_238;
              uVar1 = *(undefined8 *)
                       ((long)(this->super_LPColSetBase<double>).object.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
              uVar22 = (uint)((ulong)uVar1 >> 0x20);
              if (this->thesense == MINIMIZE) {
                uVar22 = uVar22 ^ 0x80000000;
              }
              local_290.idx = uVar22;
              local_290.info = (int)uVar1;
              local_298 = 0.0;
              local_280 = 0;
              local_278.info = 0;
              local_278.idx = -1;
              LPRowSetBase<double>::create
                        ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                         (double *)&local_290,(double *)&local_298,&local_280);
            }
          }
          else {
            local_228 = *(DataKey *)((long)pdVar2 + lVar12);
            ::soplex::infinity::__tls_init();
            bVar19 = (double)local_218 <= (double)local_228;
            local_228 = *(DataKey *)
                         ((long)(this->super_LPColSetBase<double>).low.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
            uStack_220 = 0;
            if (bVar19) {
              pTVar3 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              p_Var4 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                }
              }
              RVar6 = Tolerances::epsilon(pTVar3);
              uVar20 = SUB84(RVar6,0);
              uVar21 = (undefined4)((ulong)RVar6 >> 0x20);
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_1f8 = RVar6;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                uVar20 = SUB84(local_1f8,0);
                uVar21 = (undefined4)((ulong)local_1f8 >> 0x20);
              }
              if ((double)CONCAT44(uVar21,uVar20) < ABS((double)local_228)) {
                DSVectorBase<double>::makeMem(&local_258,1);
                local_258.super_SVectorBase<double>.m_elem
                [local_258.super_SVectorBase<double>.memused].idx = iVar15;
                local_258.super_SVectorBase<double>.m_elem
                [local_258.super_SVectorBase<double>.memused].val = 1.0;
                local_258.super_SVectorBase<double>.memused =
                     local_258.super_SVectorBase<double>.memused + 1;
                if (this->thesense == MINIMIZE) {
                  pdVar2 = (this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_288 = (DataKey)(*(ulong *)((long)pdVar2 + lVar12) ^ 0x8000000000000000);
                  local_290 = (DataKey)(*(ulong *)((long)pdVar2 + lVar12) ^ 0x8000000000000000);
                  local_298 = 0.0;
                  local_280 = 0;
                  local_278.info = 0;
                  local_278.idx = -1;
                  LPRowSetBase<double>::create
                            ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                             (double *)&local_290,(double *)&local_298,&local_280);
                  pdVar2 = (this->super_LPColSetBase<double>).low.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  local_288.info = 0;
                  local_288.idx = 0;
                  ::soplex::infinity::__tls_init();
                  local_290 = local_218;
                  local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                  local_278.info = 0;
                  local_278.idx = -1;
                  LPColSetBase<double>::add
                            ((LPColSetBase<double> *)local_1c0,&local_278,
                             (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                             &local_258.super_SVectorBase<double>,(double *)&local_290,
                             (int *)&local_298);
                }
                else {
                  local_290 = *(DataKey *)
                               ((long)(this->super_LPColSetBase<double>).object.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar12);
                  local_298 = 0.0;
                  local_280 = 0;
                  local_278.info = 0;
                  local_278.idx = -1;
                  local_288 = local_290;
                  LPRowSetBase<double>::create
                            ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                             (double *)&local_290,(double *)&local_298,&local_280);
                  pdVar2 = (this->super_LPColSetBase<double>).low.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  ::soplex::infinity::__tls_init();
                  local_288 = local_238;
                  local_290.info = 0;
                  local_290.idx = 0;
                  local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                  local_278.info = 0;
                  local_278.idx = -1;
                  LPColSetBase<double>::add
                            ((LPColSetBase<double> *)local_1c0,&local_278,
                             (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                             &local_258.super_SVectorBase<double>,(double *)&local_290,
                             (int *)&local_298);
                }
                goto LAB_001d88be;
              }
              if (this->thesense == MINIMIZE) {
                ::soplex::infinity::__tls_init();
                local_288 = local_238;
                uVar1 = *(undefined8 *)
                         ((long)(this->super_LPColSetBase<double>).object.val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
                uVar22 = (uint)((ulong)uVar1 >> 0x20);
                if (this->thesense == MINIMIZE) {
                  uVar22 = uVar22 ^ 0x80000000;
                }
                local_290.idx = uVar22;
                local_290.info = (int)uVar1;
                local_298 = 0.0;
                local_280 = 0;
                local_278.info = 0;
                local_278.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                           (double *)&local_290,(double *)&local_298,&local_280);
              }
              else {
                local_288 = *(DataKey *)
                             ((long)(this->super_LPColSetBase<double>).object.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar12);
                ::soplex::infinity::__tls_init();
                local_290 = local_218;
                local_298 = 0.0;
                local_280 = 0;
                local_278.info = 0;
                local_278.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                           (double *)&local_290,(double *)&local_298,&local_280);
              }
            }
            else {
              pTVar3 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_1f8 = *(double *)
                           ((long)(this->super_LPColSetBase<double>).up.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar12);
              p_Var4 = (this->_tolerances).
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                }
              }
              RVar6 = Tolerances::epsilon(pTVar3);
              uVar20 = SUB84(RVar6,0);
              uVar21 = (undefined4)((ulong)RVar6 >> 0x20);
              if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_1c8 = RVar6;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                uVar20 = SUB84(local_1c8,0);
                uVar21 = (undefined4)((ulong)local_1c8 >> 0x20);
              }
              if (ABS((double)local_228 - local_1f8) < (double)CONCAT44(uVar21,uVar20) ||
                  ABS((double)local_228 - local_1f8) == (double)CONCAT44(uVar21,uVar20)) {
                pdVar2 = (this->super_LPColSetBase<double>).object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar1 = *(undefined8 *)((long)pdVar2 + lVar12);
                uVar22 = (uint)((ulong)uVar1 >> 0x20);
                bVar19 = this->thesense == MINIMIZE;
                if (bVar19) {
                  uVar22 = uVar22 ^ 0x80000000;
                }
                local_288.idx = uVar22;
                local_288.info = (int)uVar1;
                uVar1 = *(undefined8 *)((long)pdVar2 + lVar12);
                uVar22 = (uint)((ulong)uVar1 >> 0x20);
                if (bVar19) {
                  uVar22 = uVar22 ^ 0x80000000;
                }
                local_290.idx = uVar22;
                local_290.info = (int)uVar1;
                local_298 = 0.0;
                local_280 = 0;
                local_278.info = 0;
                local_278.idx = -1;
                LPRowSetBase<double>::create
                          ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                           (double *)&local_290,(double *)&local_298,&local_280);
                DSVectorBase<double>::makeMem(&local_258,1);
                local_258.super_SVectorBase<double>.m_elem
                [local_258.super_SVectorBase<double>.memused].idx = iVar15;
                local_258.super_SVectorBase<double>.m_elem
                [local_258.super_SVectorBase<double>.memused].val = 1.0;
                local_258.super_SVectorBase<double>.memused =
                     local_258.super_SVectorBase<double>.memused + 1;
                pdVar2 = (this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_288.info = 0;
                local_288.idx = 0;
                ::soplex::infinity::__tls_init();
                local_290 = local_218;
                local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                local_278.info = 0;
                local_278.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_278,
                           (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                           &local_258.super_SVectorBase<double>,(double *)&local_290,
                           (int *)&local_298);
                pdVar2 = (this->super_LPColSetBase<double>).low.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_288 = local_238;
                local_290.info = 0;
                local_290.idx = 0;
                local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                local_278.info = 0;
                local_278.idx = -1;
                LPColSetBase<double>::add
                          ((LPColSetBase<double> *)local_1c0,&local_278,
                           (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                           &local_258.super_SVectorBase<double>,(double *)&local_290,
                           (int *)&local_298);
                local_258.super_SVectorBase<double>._8_8_ =
                     local_258.super_SVectorBase<double>._8_8_ & 0xffffffff;
                local_27c = local_27c + 2;
              }
              else {
                pTVar3 = (this->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_228 = *(DataKey *)
                             ((long)(this->super_LPColSetBase<double>).low.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar12);
                uStack_220 = 0;
                p_Var4 = (this->_tolerances).
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                  }
                }
                RVar6 = Tolerances::epsilon(pTVar3);
                uVar20 = SUB84(RVar6,0);
                uVar21 = (undefined4)((ulong)RVar6 >> 0x20);
                if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  local_1f8 = RVar6;
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                  uVar20 = SUB84(local_1f8,0);
                  uVar21 = (undefined4)((ulong)local_1f8 >> 0x20);
                }
                if (ABS((double)local_228) <= (double)CONCAT44(uVar21,uVar20)) {
                  DSVectorBase<double>::makeMem(&local_258,1);
                  local_258.super_SVectorBase<double>.m_elem
                  [local_258.super_SVectorBase<double>.memused].idx = iVar15;
                  local_258.super_SVectorBase<double>.m_elem
                  [local_258.super_SVectorBase<double>.memused].val = 1.0;
                  local_258.super_SVectorBase<double>.memused =
                       local_258.super_SVectorBase<double>.memused + 1;
                  if (this->thesense == MINIMIZE) {
                    ::soplex::infinity::__tls_init();
                    local_288 = local_238;
                    uVar1 = *(undefined8 *)
                             ((long)(this->super_LPColSetBase<double>).object.val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar12);
                    uVar22 = (uint)((ulong)uVar1 >> 0x20);
                    if (this->thesense == MINIMIZE) {
                      uVar22 = uVar22 ^ 0x80000000;
                    }
                    local_290.idx = uVar22;
                    local_290.info = (int)uVar1;
                    local_298 = 0.0;
                    local_280 = 0;
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPRowSetBase<double>::create
                              ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                               (double *)&local_290,(double *)&local_298,&local_280);
                    pdVar2 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    ::soplex::infinity::__tls_init();
                    local_288 = local_238;
                    local_290.info = 0;
                    local_290.idx = 0;
                    local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_278,
                               (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                               &local_258.super_SVectorBase<double>,(double *)&local_290,
                               (int *)&local_298);
                  }
                  else {
                    local_288 = *(DataKey *)
                                 ((long)(this->super_LPColSetBase<double>).object.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar12);
                    ::soplex::infinity::__tls_init();
                    local_290 = local_218;
                    local_298 = 0.0;
                    local_280 = 0;
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPRowSetBase<double>::create
                              ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                               (double *)&local_290,(double *)&local_298,&local_280);
                    pdVar2 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_288.info = 0;
                    local_288.idx = 0;
                    ::soplex::infinity::__tls_init();
                    local_290 = local_218;
                    local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_278,
                               (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                               &local_258.super_SVectorBase<double>,(double *)&local_290,
                               (int *)&local_298);
                  }
LAB_001d88be:
                  local_27c = local_27c + 1;
                }
                else {
                  pTVar3 = (this->_tolerances).
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  local_228 = *(DataKey *)
                               ((long)(this->super_LPColSetBase<double>).up.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar12);
                  uStack_220 = 0;
                  p_Var4 = (this->_tolerances).
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
                    }
                  }
                  RVar6 = Tolerances::epsilon(pTVar3);
                  uVar20 = SUB84(RVar6,0);
                  uVar21 = (undefined4)((ulong)RVar6 >> 0x20);
                  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    local_1f8 = RVar6;
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                    uVar20 = SUB84(local_1f8,0);
                    uVar21 = (undefined4)((ulong)local_1f8 >> 0x20);
                  }
                  if (ABS((double)local_228) <= (double)CONCAT44(uVar21,uVar20)) {
                    DSVectorBase<double>::makeMem(&local_258,1);
                    local_258.super_SVectorBase<double>.m_elem
                    [local_258.super_SVectorBase<double>.memused].idx = iVar15;
                    local_258.super_SVectorBase<double>.m_elem
                    [local_258.super_SVectorBase<double>.memused].val = 1.0;
                    local_258.super_SVectorBase<double>.memused =
                         local_258.super_SVectorBase<double>.memused + 1;
                    if (this->thesense == MINIMIZE) {
                      local_288 = (DataKey)(*(ulong *)((long)(this->super_LPColSetBase<double>).
                                                             object.val.
                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar12
                                                  ) ^ 0x8000000000000000);
                      ::soplex::infinity::__tls_init();
                      local_290 = local_218;
                      local_298 = 0.0;
                      local_280 = 0;
                      local_278.info = 0;
                      local_278.idx = -1;
                      LPRowSetBase<double>::create
                                ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                                 (double *)&local_290,(double *)&local_298,&local_280);
                      pdVar2 = (this->super_LPColSetBase<double>).low.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_288.info = 0;
                      local_288.idx = 0;
                      ::soplex::infinity::__tls_init();
                      local_290 = local_218;
                      local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                      local_278.info = 0;
                      local_278.idx = -1;
                      LPColSetBase<double>::add
                                ((LPColSetBase<double> *)local_1c0,&local_278,
                                 (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                                 &local_258.super_SVectorBase<double>,(double *)&local_290,
                                 (int *)&local_298);
                    }
                    else {
                      ::soplex::infinity::__tls_init();
                      local_288 = local_238;
                      uVar1 = *(undefined8 *)
                               ((long)(this->super_LPColSetBase<double>).object.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar12);
                      uVar22 = (uint)((ulong)uVar1 >> 0x20);
                      if (this->thesense == MINIMIZE) {
                        uVar22 = uVar22 ^ 0x80000000;
                      }
                      local_290.idx = uVar22;
                      local_290.info = (int)uVar1;
                      local_298 = 0.0;
                      local_280 = 0;
                      local_278.info = 0;
                      local_278.idx = -1;
                      LPRowSetBase<double>::create
                                ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                                 (double *)&local_290,(double *)&local_298,&local_280);
                      pdVar2 = (this->super_LPColSetBase<double>).low.val.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      ::soplex::infinity::__tls_init();
                      local_288 = local_238;
                      local_290.info = 0;
                      local_290.idx = 0;
                      local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                      local_278.info = 0;
                      local_278.idx = -1;
                      LPColSetBase<double>::add
                                ((LPColSetBase<double> *)local_1c0,&local_278,
                                 (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                                 &local_258.super_SVectorBase<double>,(double *)&local_290,
                                 (int *)&local_298);
                    }
                    goto LAB_001d88be;
                  }
                  pdVar2 = (this->super_LPColSetBase<double>).object.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar1 = *(undefined8 *)((long)pdVar2 + lVar12);
                  uVar22 = (uint)((ulong)uVar1 >> 0x20);
                  bVar19 = this->thesense == MINIMIZE;
                  if (bVar19) {
                    uVar22 = uVar22 ^ 0x80000000;
                  }
                  local_288.idx = uVar22;
                  local_288.info = (int)uVar1;
                  uVar1 = *(undefined8 *)((long)pdVar2 + lVar12);
                  uVar22 = (uint)((ulong)uVar1 >> 0x20);
                  if (bVar19) {
                    uVar22 = uVar22 ^ 0x80000000;
                  }
                  local_290.idx = uVar22;
                  local_290.info = (int)uVar1;
                  local_298 = 0.0;
                  local_280 = 0;
                  local_278.info = 0;
                  local_278.idx = -1;
                  LPRowSetBase<double>::create
                            ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                             (double *)&local_290,(double *)&local_298,&local_280);
                  DSVectorBase<double>::makeMem(&local_258,1);
                  local_258.super_SVectorBase<double>.m_elem
                  [local_258.super_SVectorBase<double>.memused].idx = iVar15;
                  local_258.super_SVectorBase<double>.m_elem
                  [local_258.super_SVectorBase<double>.memused].val = 1.0;
                  local_258.super_SVectorBase<double>.memused =
                       local_258.super_SVectorBase<double>.memused + 1;
                  pdVar17 = (double *)
                            ((long)(this->super_LPColSetBase<double>).low.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar12);
                  if (this->thesense == MINIMIZE) {
                    local_288.info = 0;
                    local_288.idx = 0;
                    ::soplex::infinity::__tls_init();
                    local_290 = local_218;
                    local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_278,pdVar17,
                               (double *)&local_288,&local_258.super_SVectorBase<double>,
                               (double *)&local_290,(int *)&local_298);
                    pdVar2 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    ::soplex::infinity::__tls_init();
                    local_288 = local_238;
                    local_290.info = 0;
                    local_290.idx = 0;
                    local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_278,
                               (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                               &local_258.super_SVectorBase<double>,(double *)&local_290,
                               (int *)&local_298);
                  }
                  else {
                    ::soplex::infinity::__tls_init();
                    local_288 = local_238;
                    local_290.info = 0;
                    local_290.idx = 0;
                    local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_278,pdVar17,
                               (double *)&local_288,&local_258.super_SVectorBase<double>,
                               (double *)&local_290,(int *)&local_298);
                    pdVar2 = (this->super_LPColSetBase<double>).up.val.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    local_288.info = 0;
                    local_288.idx = 0;
                    ::soplex::infinity::__tls_init();
                    local_290 = local_218;
                    local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
                    local_278.info = 0;
                    local_278.idx = -1;
                    LPColSetBase<double>::add
                              ((LPColSetBase<double> *)local_1c0,&local_278,
                               (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                               &local_258.super_SVectorBase<double>,(double *)&local_290,
                               (int *)&local_298);
                  }
                  local_27c = local_27c + 2;
                }
                local_258.super_SVectorBase<double>._8_8_ =
                     local_258.super_SVectorBase<double>._8_8_ & 0xffffffff;
              }
            }
          }
        }
        else {
          local_228 = *(DataKey *)
                       ((long)(this->super_LPColSetBase<double>).up.val.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar12);
          ::soplex::infinity::__tls_init();
          if ((double)local_228 < (double)local_218) goto LAB_001d7523;
          pdVar2 = (this->super_LPColSetBase<double>).object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = *(undefined8 *)((long)pdVar2 + lVar12);
          uVar22 = (uint)((ulong)uVar1 >> 0x20);
          bVar19 = this->thesense == MINIMIZE;
          if (bVar19) {
            uVar22 = uVar22 ^ 0x80000000;
          }
          local_288.idx = uVar22;
          local_288.info = (int)uVar1;
          uVar1 = *(undefined8 *)((long)pdVar2 + lVar12);
          uVar22 = (uint)((ulong)uVar1 >> 0x20);
          if (bVar19) {
            uVar22 = uVar22 ^ 0x80000000;
          }
          local_290.idx = uVar22;
          local_290.info = (int)uVar1;
          local_298 = 0.0;
          local_280 = 0;
          local_278.info = 0;
          local_278.idx = -1;
          LPRowSetBase<double>::create
                    ((LPRowSetBase<double> *)local_f8,&local_278,0,(double *)&local_288,
                     (double *)&local_290,(double *)&local_298,&local_280);
        }
        uVar16 = uVar16 + 1;
        lVar12 = lVar12 + 8;
      } while ((long)uVar16 <
               (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      local_238 = (DataKey)(long)local_27c;
      dualLP = local_200;
    }
    (*(dualLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[8])(dualLP,local_f8,0);
    iVar15 = (int)uVar16;
    if (iVar15 != 0) {
      uVar13 = 0;
      do {
        local_288 = (local_200->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                    [uVar13];
        SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
        local_1e8[uVar13].super_DataKey = local_278;
        uVar13 = uVar13 + 1;
      } while ((uVar16 & 0xffffffff) != uVar13);
    }
    *nprimalcols = iVar15;
    *ndualrows = iVar15;
    if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
      uVar22 = 0;
      pSVar14 = local_200;
    }
    else {
      pDVar8 = (DataKey *)__tls_get_addr(&PTR_003b4b70);
      local_228 = *pDVar8;
      uStack_220 = 0;
      local_218 = (DataKey)((ulong)local_228 ^ 0x8000000000000000);
      uStack_210 = 0x8000000000000000;
      lVar12 = 0;
      lVar18 = 0;
      uVar22 = 0;
      pSVar14 = local_200;
      do {
        TVar7 = LPRowSetBase<double>::type(&this->super_LPRowSetBase<double>,(int)lVar18);
        switch(TVar7) {
        case LESS_EQUAL:
          local_288 = *(DataKey *)
                       ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                               thekey)->info + lVar12);
          SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
          local_1f0[(int)uVar22].super_DataKey = local_278;
          uVar22 = uVar22 + 1;
          pdVar17 = (double *)
                    ((long)(this->super_LPRowSetBase<double>).right.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12);
          if (this->thesense == MINIMIZE) {
            ::soplex::infinity::__tls_init();
            local_288 = local_218;
            local_290.info = 0;
            local_290.idx = 0;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,pdVar17,(double *)&local_288,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_290,
                       (int *)&local_298);
          }
          else {
            local_288.info = 0;
            local_288.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            ::soplex::infinity::__tls_init();
            local_290 = local_228;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,pdVar17,(double *)&local_288,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_290,
                       (int *)&local_298);
            pSVar14 = local_200;
          }
          break;
        case EQUAL:
          local_288 = *(DataKey *)
                       ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                               thekey)->info + lVar12);
          SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
          local_1f0[(int)uVar22].super_DataKey = local_278;
          pdVar2 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_288 = local_218;
          iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                   thekey)->idx + lVar12);
          pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          ::soplex::infinity::__tls_init();
          local_290 = local_228;
          local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
          local_278.info = 0;
          local_278.idx = -1;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)local_1c0,&local_278,(double *)((long)pdVar2 + lVar12),
                     (double *)&local_288,(SVectorBase<double> *)(pIVar5 + iVar15),
                     (double *)&local_290,(int *)&local_298);
          uVar22 = uVar22 + 1;
          pSVar14 = local_200;
          break;
        case GREATER_EQUAL:
          local_288 = *(DataKey *)
                       ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                               thekey)->info + lVar12);
          SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
          local_1f0[(int)uVar22].super_DataKey = local_278;
          uVar22 = uVar22 + 1;
          pdVar17 = (double *)
                    ((long)(this->super_LPRowSetBase<double>).left.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar12);
          if (this->thesense == MINIMIZE) {
            local_288.info = 0;
            local_288.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            ::soplex::infinity::__tls_init();
            local_290 = local_228;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,pdVar17,(double *)&local_288,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_290,
                       (int *)&local_298);
            pSVar14 = local_200;
          }
          else {
            ::soplex::infinity::__tls_init();
            local_288 = local_218;
            local_290.info = 0;
            local_290.idx = 0;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,pdVar17,(double *)&local_288,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_290,
                       (int *)&local_298);
          }
          break;
        case RANGE:
          local_1e8 = (SPxRowId *)CONCAT44(local_1e8._4_4_,uVar22);
          if (this->thesense == MINIMIZE) {
            local_288 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
            local_1e0 = (SPxColId *)(long)(int)uVar22;
            local_1f0[(long)local_1e0].super_DataKey = local_278;
            pdVar2 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_288.info = 0;
            local_288.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            ::soplex::infinity::__tls_init();
            local_290 = local_228;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,
                       (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_290,
                       (int *)&local_298);
            local_288 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
            pSVar14 = local_200;
            local_1f0[(long)((long)&(local_1e0->super_DataKey).info + 1)].super_DataKey = local_278;
            pdVar2 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar15 = (int)local_1e8;
            ::soplex::infinity::__tls_init();
            local_288 = local_218;
            local_290.info = 0;
            local_290.idx = 0;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,
                       (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_290,
                       (int *)&local_298);
            uVar22 = iVar15 + 2;
          }
          else {
            local_288 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
            local_1f0[(int)uVar22].super_DataKey = local_278;
            pdVar2 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_288 = local_218;
            local_290.info = 0;
            local_290.idx = 0;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,
                       (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                       (SVectorBase<double> *)
                       ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                       *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                        set.thekey)->idx + lVar12)),(double *)&local_290,
                       (int *)&local_298);
            local_288 = *(DataKey *)
                         ((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.
                                 thekey)->info + lVar12);
            SPxRowId::SPxRowId((SPxRowId *)&local_278,&local_288);
            local_1f0[(long)(int)uVar22 + 1].super_DataKey = local_278;
            pdVar2 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_288.info = 0;
            local_288.idx = 0;
            iVar15 = *(int *)((long)&((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set
                                     .thekey)->idx + lVar12);
            pIVar5 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
            iVar10 = (int)local_1e8;
            ::soplex::infinity::__tls_init();
            local_290 = local_228;
            local_298 = (double)((ulong)local_298 & 0xffffffff00000000);
            local_278.info = 0;
            local_278.idx = -1;
            LPColSetBase<double>::add
                      ((LPColSetBase<double> *)local_1c0,&local_278,
                       (double *)((long)pdVar2 + lVar12),(double *)&local_288,
                       (SVectorBase<double> *)(pIVar5 + iVar15),(double *)&local_290,
                       (int *)&local_298);
            uVar22 = iVar10 + 2;
            pSVar14 = local_200;
          }
          break;
        default:
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_278 = (DataKey)local_268;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"XLPFRD01 This should never happen.","");
          *puVar9 = &PTR__SPxException_003adbd8;
          puVar9[1] = puVar9 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar9 + 1),local_278,
                     (long)&(local_270->super_DataKey).info + (long)local_278);
          *puVar9 = &PTR__SPxException_003ae9a0;
          __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        lVar18 = lVar18 + 1;
        lVar12 = lVar12 + 8;
      } while (lVar18 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
    (*(pSVar14->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xd])(pSVar14,local_1c0,0);
    if (0 < (int)uVar22) {
      local_238 = (DataKey)((long)local_238 << 3);
      uVar16 = 0;
      do {
        local_288 = *(DataKey *)
                     ((long)&(pSVar14->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                             thekey[uVar16].info + (long)local_238);
        SPxColId::SPxColId((SPxColId *)&local_278,&local_288);
        local_1d0[uVar16].super_DataKey = local_278;
        uVar16 = uVar16 + 1;
      } while (uVar22 != uVar16);
    }
    *nprimalrows = uVar22;
    *ndualcols = uVar22;
    local_258._vptr_DSVectorBase = local_1d8;
    if (local_258.theelem != (Nonzero<double> *)0x0) {
      free(local_258.theelem);
    }
    LPColSetBase<double>::~LPColSetBase((LPColSetBase<double> *)local_1c0);
    LPRowSetBase<double>::~LPRowSetBase((LPRowSetBase<double> *)local_f8);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::buildDualProblem(SPxLPBase<R>& dualLP, SPxRowId primalRowIds[],
                                    SPxColId primalColIds[],
                                    SPxRowId dualRowIds[], SPxColId dualColIds[], int* nprimalrows, int* nprimalcols, int* ndualrows,
                                    int* ndualcols)
{
   // Setting up the primalrowids and dualcolids arrays if not given as parameters
   if(primalRowIds == nullptr || primalColIds == nullptr || dualRowIds == nullptr
         || dualColIds == nullptr)
   {
      DataArray < SPxRowId > primalrowids(2 * nRows());
      DataArray < SPxColId > primalcolids(2 * nCols());
      DataArray < SPxRowId > dualrowids(2 * nCols());
      DataArray < SPxColId > dualcolids(2 * nRows());
      int numprimalrows = 0;
      int numprimalcols = 0;
      int numdualrows = 0;
      int numdualcols = 0;

      buildDualProblem(dualLP, primalrowids.get_ptr(), primalcolids.get_ptr(), dualrowids.get_ptr(),
                       dualcolids.get_ptr(), &numprimalrows, &numprimalcols, &numdualrows, &numdualcols);

      if(primalRowIds != nullptr)
      {
         primalRowIds = primalrowids.get_ptr();
         (*nprimalrows) = numprimalrows;
      }

      if(primalColIds != nullptr)
      {
         primalColIds = primalcolids.get_ptr();
         (*nprimalcols) = numprimalcols;
      }

      if(dualRowIds != nullptr)
      {
         dualRowIds = dualrowids.get_ptr();
         (*ndualrows) = numdualrows;
      }

      if(dualColIds != nullptr)
      {
         dualColIds = dualcolids.get_ptr();
         (*ndualcols) = numdualcols;
      }

      return;
   }

   // setting the sense of the dual LP
   if(spxSense() == MINIMIZE)
      dualLP.changeSense(MAXIMIZE);
   else
      dualLP.changeSense(MINIMIZE);

   LPRowSetBase<R> dualrows(nCols());
   LPColSetBase<R> dualcols(nRows());
   DSVectorBase<R> col(1);

   int numAddedRows = 0;
   int numVarBoundCols = 0;
   int primalrowsidx = 0;
   int primalcolsidx = 0;

   for(int i = 0; i < nCols(); ++i)
   {
      primalColIds[primalcolsidx] = cId(i);
      primalcolsidx++;

      if(lower(i) <= R(-infinity) && upper(i) >= R(infinity))   // unrestricted variables
      {
         dualrows.create(0, obj(i), obj(i));
         numAddedRows++;
      }
      else if(lower(i) <= R(-infinity))   // no lower bound is set, indicating a <= 0 variable
      {
         if(isZero(upper(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, obj(i), R(infinity));
            else
               dualrows.create(0, R(-infinity), obj(i));
         }
         else // additional upper bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(upper(i) >= R(infinity))   // no upper bound set, indicating a >= 0 variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // standard bound variable
         {
            if(spxSense() == MINIMIZE)
               dualrows.create(0, R(-infinity), obj(i));
            else
               dualrows.create(0, obj(i), R(infinity));
         }
         else // additional lower bound on the variable
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, obj(i), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }

         numAddedRows++;
      }
      else if(NE(lower(i), upper(i), this->tolerances()->epsilon()))   // a boxed variable
      {
         if(isZero(lower(i), this->tolerances()->epsilon()))   // variable bounded between 0 and upper(i)
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols++;
         }
         else if(isZero(upper(i),
                        this->tolerances()->epsilon()))   // variable bounded between lower(i) and 0
         {
            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualrows.create(0, obj(i), R(infinity));
               dualcols.add(lower(i), 0.0, col, R(infinity));
            }
            else
            {
               dualrows.create(0, R(-infinity), obj(i));
               dualcols.add(lower(i), R(-infinity), col, 0.0);
            }

            col.clear();

            numVarBoundCols++;
         }
         else // variable bounded between lower(i) and upper(i)
         {
            dualrows.create(0, obj(i), obj(i));

            col.add(numAddedRows, 1.0);

            if(spxSense() == MINIMIZE)
            {
               dualcols.add(lower(i), 0.0, col, R(infinity));
               dualcols.add(upper(i), R(-infinity), col, 0.0);
            }
            else
            {
               dualcols.add(lower(i), R(-infinity), col, 0.0);
               dualcols.add(upper(i), 0.0, col, R(infinity));
            }

            col.clear();

            numVarBoundCols += 2;
         }

         numAddedRows++;
      }
      else
      {
         assert(lower(i) == upper(i));

         dualrows.create(0, obj(i), obj(i));

         col.add(numAddedRows, 1.0);
         dualcols.add(lower(i), 0, col, R(infinity));
         dualcols.add(lower(i), R(-infinity), col, 0);
         col.clear();

         numVarBoundCols += 2;
         numAddedRows++;
      }
   }

   // adding the empty rows to the dual LP
   dualLP.addRows(dualrows);

   // setting the dual row ids for the related primal cols.
   // this assumes that the rows are added in sequential order.
   for(int i = 0; i < primalcolsidx; i++)
      dualRowIds[i] = dualLP.rId(i);

   (*nprimalcols) = primalcolsidx;
   (*ndualrows) = primalcolsidx;

   // iterating over each of the rows to create dual columns
   for(int i = 0; i < nRows(); ++i)
   {
      // checking the type of the row
      switch(rowType(i))
      {
      case LPRowBase<R>::RANGE: // range constraint, requires the addition of two dual variables
         assert(lhs(i) > R(-infinity));
         assert(rhs(i) < R(infinity));

         if(spxSense() == MINIMIZE)
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         }
         else
         {
            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

            primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
            primalrowsidx++;
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));
         }

         break;

      case LPRowBase<R>::GREATER_EQUAL: // >= constraint
         assert(lhs(i) > R(-infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(lhs(i), 0.0, rowVector(i), R(infinity));
         else
            dualcols.add(lhs(i), R(-infinity), rowVector(i), 0.0);

         break;

      case LPRowBase<R>::LESS_EQUAL: // <= constriant
         assert(rhs(i) < R(infinity));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;

         if(spxSense() == MINIMIZE)
            dualcols.add(rhs(i), R(-infinity), rowVector(i), 0.0);
         else
            dualcols.add(rhs(i), 0.0, rowVector(i), R(infinity));

         break;

      case LPRowBase<R>::EQUAL: // Equality constraint
         assert(EQ(lhs(i), rhs(i), this->tolerances()->epsilon()));
         primalRowIds[primalrowsidx] = rId(i); // setting the rowid for the primal row
         primalrowsidx++;
         dualcols.add(rhs(i), R(-infinity), rowVector(i), R(infinity));
         break;

      default:
         throw SPxInternalCodeException("XLPFRD01 This should never happen.");
      }
   }

   // adding the filled columns to the dual LP
   dualLP.addCols(dualcols);

   // setting the dual column ids for the related primal rows.
   // this assumes that the columns are added in sequential order.
   for(int i = 0; i < primalrowsidx; i++)
      dualColIds[i] = dualLP.cId(i + numVarBoundCols);

   (*nprimalrows) = primalrowsidx;
   (*ndualcols) = primalrowsidx;
}